

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcMaj3.c
# Opt level: O3

void Zyx_ManPrintSolution(Zyx_Man_t *p,int fCompl,int fFirst)

{
  uint uVar1;
  ulong *puVar2;
  ulong uVar3;
  word *pwVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  FILE *__stream;
  char cVar9;
  Bmc_EsPar_t *pBVar10;
  uint uVar11;
  ulong uVar12;
  ulong *puVar13;
  char *pcVar14;
  long lVar15;
  int iVar16;
  bool bVar17;
  char local_418 [1000];
  
  pBVar10 = p->pPars;
  pcVar14 = "MAJ-gates";
  if (pBVar10->fMajority == 0) {
    pcVar14 = "LUTs";
  }
  printf("Realization of given %d-input function using %d %d-input %s:\n",
         (ulong)(uint)pBVar10->nVars,(ulong)(uint)pBVar10->nNodes,(ulong)(uint)pBVar10->nLutSize,
         pcVar14);
  uVar11 = p->nObjs;
  pBVar10 = p->pPars;
  uVar6 = pBVar10->nVars;
  uVar5 = uVar11;
  if ((int)uVar6 < (int)uVar11) {
    do {
      uVar5 = uVar5 - 1;
      uVar1 = uVar11 - 1;
      printf("%02d = ");
      if (p->pPars->fMajority == 0) {
        printf("%d\'b",(ulong)(uint)(1 << ((byte)p->pPars->nLutSize & 0x1f)));
        iVar7 = p->LutMask;
        if (-1 < iVar7) {
          do {
            uVar6 = bmcg_sat_solver_read_cex_varvalue
                              (p->pSat,(uVar5 - p->pPars->nVars) * (p->LutMask + 1) + iVar7);
            printf("%d",(ulong)((uVar11 == p->nObjs && fCompl != 0) ^ uVar6));
            bVar17 = iVar7 != 0;
            iVar7 = iVar7 + -1;
          } while (bVar17);
        }
      }
      else {
        printf("MAJ3");
      }
      putchar(0x28);
      if (1 < (int)uVar11) {
        uVar11 = 0;
        do {
          iVar7 = bmcg_sat_solver_read_cex_varvalue
                            (p->pSat,(uVar5 - p->pPars->nVars) * p->nObjs + p->TopoBase + uVar11);
          if (iVar7 != 0) {
            if ((int)uVar11 < p->pPars->nVars) {
              pcVar14 = " %c";
              uVar6 = uVar11 + 0x61;
            }
            else {
              pcVar14 = " %02d";
              uVar6 = uVar11;
            }
            printf(pcVar14,(ulong)uVar6);
          }
          uVar11 = uVar11 + 1;
        } while (uVar5 != uVar11);
      }
      puts(" )");
      pBVar10 = p->pPars;
      uVar6 = pBVar10->nVars;
      uVar11 = uVar1;
    } while ((int)uVar6 < (int)uVar1);
  }
  if (pBVar10->fMajority == 0) {
    puVar2 = p->pTruth;
    cVar9 = (char)uVar6;
    if (fCompl != 0) {
      uVar11 = 1 << (cVar9 - 6U & 0x1f);
      if ((int)uVar6 < 7) {
        uVar11 = 1;
      }
      if (0 < (int)uVar11) {
        uVar12 = 0;
        do {
          puVar2[uVar12] = ~puVar2[uVar12];
          uVar12 = uVar12 + 1;
        } while (uVar11 != uVar12);
      }
    }
    if ((int)uVar6 < 2) {
      __assert_fail("nVars >= 2",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/utilTruth.h"
                    ,0x4f1,"int Abc_TtWriteHexRev(char *, word *, int)");
    }
    iVar7 = 1 << (cVar9 - 6U & 0x1f);
    if (uVar6 < 7) {
      iVar7 = 1;
    }
    puVar13 = puVar2 + (long)iVar7 + -1;
    if (puVar2 <= puVar13) {
      uVar12 = 0xf;
      if ((int)uVar6 < 6) {
        uVar12 = (ulong)(uint)~(-1 << (cVar9 - 2U & 0x1f));
      }
      pcVar14 = local_418;
      do {
        uVar3 = *puVar13;
        lVar15 = uVar12 << 2;
        do {
          uVar11 = (uint)(uVar3 >> ((byte)lVar15 & 0x3c)) & 0xf;
          cVar9 = '7';
          if (uVar11 < 10) {
            cVar9 = '0';
          }
          *pcVar14 = cVar9 + (char)uVar11;
          pcVar14 = pcVar14 + 1;
          lVar15 = lVar15 + -4;
        } while (lVar15 != -4);
        puVar13 = puVar13 + -1;
      } while (puVar2 <= puVar13);
      pBVar10 = p->pPars;
      uVar6 = pBVar10->nVars;
    }
    if (fCompl != 0) {
      uVar11 = 1 << ((char)uVar6 - 6U & 0x1f);
      if ((int)uVar6 < 7) {
        uVar11 = 1;
      }
      if (0 < (int)uVar11) {
        pwVar4 = p->pTruth;
        uVar12 = 0;
        do {
          pwVar4[uVar12] = ~pwVar4[uVar12];
          uVar12 = uVar12 + 1;
        } while (uVar11 != uVar12);
      }
    }
    sprintf(local_418 + (1 << ((char)uVar6 - 2U & 0x1f)),"-%d-%d.bool",
            (ulong)(uint)pBVar10->nLutSize,(ulong)(uint)pBVar10->nNodes);
    pcVar14 = "wb";
    if (fFirst == 0) {
      pcVar14 = "ab";
    }
    __stream = fopen(local_418,pcVar14);
    if (__stream == (FILE *)0x0) {
      pcVar14 = "Cannot open input file \"%s\".\n";
    }
    else {
      iVar7 = p->pPars->nVars;
      if (iVar7 < p->nObjs) {
        do {
          fputc(iVar7 + 0x41,__stream);
          if (p->pPars->fMajority == 0) {
            iVar16 = p->LutMask;
            if (-1 < iVar16) {
              do {
                uVar11 = bmcg_sat_solver_read_cex_varvalue
                                   (p->pSat,(iVar7 - p->pPars->nVars) * (p->LutMask + 1) + iVar16);
                fprintf(__stream,"%d",(ulong)((iVar7 == p->nObjs + -1 && fCompl != 0) ^ uVar11));
                bVar17 = iVar16 != 0;
                iVar16 = iVar16 + -1;
              } while (bVar17);
            }
            if (0 < iVar7) {
              iVar16 = 0;
              do {
                iVar8 = bmcg_sat_solver_read_cex_varvalue
                                  (p->pSat,(iVar7 - p->pPars->nVars) * p->nObjs + p->TopoBase +
                                           iVar16);
                if (iVar8 != 0) {
                  fputc((uint)(iVar16 < p->pPars->nVars) * 0x20 + iVar16 + 0x41,__stream);
                }
                iVar16 = iVar16 + 1;
              } while (iVar7 != iVar16);
            }
          }
          else {
            fwrite("maj3",4,1,__stream);
          }
          fputc(10,__stream);
          iVar7 = iVar7 + 1;
        } while (iVar7 < p->nObjs);
      }
      fputc(10,__stream);
      fclose(__stream);
      pcVar14 = "Dumped solution into file \"%s\".\n";
    }
    printf(pcVar14,local_418);
  }
  return;
}

Assistant:

static void Zyx_ManPrintSolution( Zyx_Man_t * p, int fCompl, int fFirst )
{
    int i, k;
    printf( "Realization of given %d-input function using %d %d-input %s:\n", 
        p->pPars->nVars, p->pPars->nNodes, p->pPars->nLutSize, p->pPars->fMajority ? "MAJ-gates" : "LUTs" );
    for ( i = p->nObjs - 1; i >= p->pPars->nVars; i-- )
    {
        printf( "%02d = ", i );
        if ( p->pPars->fMajority )
            printf( "MAJ3" );
        else
        {
            printf( "%d\'b", 1 << p->pPars->nLutSize );
            for ( k = p->LutMask; k >= 0; k-- )
                printf( "%d", bmcg_sat_solver_read_cex_varvalue(p->pSat, Zyx_FuncVar(p, i, k)) ^ (i == p->nObjs - 1 && fCompl) );
        }
        printf( "(" );
        for ( k = 0; k < i; k++ )
            if ( bmcg_sat_solver_read_cex_varvalue(p->pSat, Zyx_TopoVar(p, i, k)) )
            {
                if ( k >= 0 && k < p->pPars->nVars )
                    printf( " %c", 'a'+k );
                else
                    printf( " %02d", k );
            }
        printf( " )\n" );
    }
    if ( !p->pPars->fMajority )
        Zyx_ManPrintSolutionFile( p, fCompl, fFirst );
}